

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWeakReference.h
# Opt level: O2

void __thiscall
Memory::WeakReferenceHashTable<PrimePolicy>::Resize
          (WeakReferenceHashTable<PrimePolicy> *this,int newSize)

{
  Type pRVar1;
  code *pcVar2;
  bool bVar3;
  hash_t hVar4;
  Memory *this_00;
  RecyclerWeakReferenceBase **ppRVar5;
  undefined4 *puVar6;
  uint uVar7;
  RecyclerWeakReferenceBase *pRVar8;
  ulong uVar9;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&RecyclerWeakReferenceBase*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18a09a;
  data.filename._0_4_ = 0x137;
  data.plusSize = (long)newSize;
  this_00 = (Memory *)HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_60);
  ppRVar5 = AllocateArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*,false>
                      (this_00,(HeapAllocator *)HeapAllocator::AllocZero,0,(long)newSize);
  uVar7 = 0;
  uVar9 = 0;
  while (uVar9 < this->size) {
    pRVar8 = this->buckets[uVar9];
    data._32_8_ = uVar9;
    while (pRVar8 != (RecyclerWeakReferenceBase *)0x0) {
      hVar4 = HashKeyToBucket(this,pRVar8->strongRef,newSize);
      pRVar1 = pRVar8->next;
      pRVar8->next = ppRVar5[(int)hVar4];
      ppRVar5[(int)hVar4] = pRVar8;
      uVar7 = uVar7 + 1;
      pRVar8 = pRVar1;
    }
    uVar9 = data._32_8_ + 1;
  }
  DeleteArray<Memory::HeapAllocator,Memory::RecyclerWeakReferenceBase*>
            (this->allocator,(ulong)this->size,this->buckets);
  this->size = newSize;
  this->buckets = ppRVar5;
  if (this->count != uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWeakReference.h"
                       ,0x14d,"(this->count == copiedEntries)","this->count == copiedEntries");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

void Resize(int newSize)
    {
#if DEBUG
        uint copiedEntries = 0;
#endif
        RecyclerWeakReferenceBase** newBuckets = AllocatorNewArrayZ(HeapAllocator, allocator, RecyclerWeakReferenceBase*, newSize);

        for (uint i=0; i < size; i++)
        {
            RecyclerWeakReferenceBase* current = buckets[i];
            while (current != nullptr)
            {
                int targetBucket = HashKeyToBucket(current->strongRef, newSize);
                RecyclerWeakReferenceBase* next = current->next; // Cache the next pointer

                AddEntry(current, &newBuckets[targetBucket]);
#if DEBUG
                copiedEntries++;
#endif
                current = next;
            }
        }

        AllocatorDeleteArray(HeapAllocator, allocator, size, buckets);
        size = newSize;
        buckets = newBuckets;
#if DEBUG
        Assert(this->count == copiedEntries);
#endif
    }